

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

int32 read_classdef_file(hash_table_t *classes,char *file_name)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  int32 iVar4;
  FILE *__stream;
  char *pcVar5;
  glist_t g;
  classdef_t *classdef;
  char **ppcVar6;
  float32 *pfVar7;
  classdef_t *pcVar8;
  long lVar9;
  gnode_s *pgVar10;
  gnode_s *pgVar11;
  undefined4 uVar12;
  float32 val;
  double dVar13;
  int32 is_pipe;
  char *wptr [2];
  char line [512];
  glist_t local_270;
  char *local_268;
  int32 local_25c;
  char *local_258;
  char *local_250;
  hash_table_t *local_240;
  classdef_t local_238 [21];
  
  __stream = (FILE *)fopen_comp(file_name,"r",&local_25c);
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x394,"File %s not found\n",file_name);
    iVar4 = -1;
  }
  else {
    iVar3 = feof(__stream);
    if (iVar3 == 0) {
      bVar1 = false;
      local_268 = (char *)0x0;
      local_270 = (glist_t)0x0;
      g = (glist_t)0x0;
      local_240 = classes;
LAB_00105d32:
      pcVar5 = fgets((char *)local_238,0x200,__stream);
      if (pcVar5 == (char *)0x0) {
        uVar12 = 3;
      }
      else {
        uVar12 = 2;
        iVar4 = str2words((char *)local_238,&local_258,2);
        if (0 < iVar4) {
          if (bVar1) {
            val = 1.0;
            if (iVar4 == 2) {
              iVar3 = strcmp(local_258,"END");
              if (iVar3 == 0) {
                bVar1 = true;
                uVar12 = 4;
                if ((local_268 != (char *)0x0) && (iVar3 = strcmp(local_250,local_268), iVar3 == 0))
                {
                  classdef = (classdef_t *)
                             __ckd_calloc__(1,0x18,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                            ,0x3b1);
                  g = glist_reverse(g);
                  local_270 = glist_reverse(local_270);
                  iVar4 = glist_count(g);
                  classdef->n_words = iVar4;
                  ppcVar6 = (char **)__ckd_calloc__((long)iVar4,8,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                                  ,0x3b6);
                  classdef->words = ppcVar6;
                  pfVar7 = (float32 *)
                           __ckd_calloc__((long)classdef->n_words,4,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                          ,0x3b8);
                  classdef->weights = pfVar7;
                  iVar3 = classdef->n_words;
                  if (0 < (long)iVar3) {
                    lVar9 = 0;
                    pgVar10 = local_270;
                    pgVar11 = g;
                    do {
                      *(anytype_t *)(classdef->words + lVar9) = pgVar11->data;
                      classdef->weights[lVar9] = (float32)(float)(pgVar10->data).fl;
                      pgVar11 = pgVar11->next;
                      pgVar10 = pgVar10->next;
                      lVar9 = lVar9 + 1;
                    } while (iVar3 != lVar9);
                  }
                  pcVar8 = (classdef_t *)hash_table_enter(local_240,local_268,classdef);
                  if (pcVar8 == classdef) {
                    glist_free(g);
                    glist_free(local_270);
                    g = (glist_t)0x0;
                    local_270 = (glist_t)0x0;
                    local_268 = (char *)0x0;
                    uVar2 = 0;
                  }
                  else {
                    classdef_free(classdef);
                    uVar2 = 4;
                  }
                  goto LAB_00105e1e;
                }
                goto LAB_00105e20;
              }
              dVar13 = atof_c(local_250);
              val = (float32)(float)dVar13;
            }
            pcVar5 = __ckd_salloc__(local_258,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                    ,0x3d9);
            g = glist_add_ptr(g,pcVar5);
            local_270 = glist_add_float32(local_270,val);
            bVar1 = true;
            uVar12 = 0;
          }
          else {
            uVar12 = 0;
            uVar2 = 0;
            if ((iVar4 == 2) && (iVar3 = strcmp(local_258,"LMCLASS"), uVar2 = 0, iVar3 == 0)) {
              local_268 = __ckd_salloc__(local_250,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                         ,0x3e3);
              bVar1 = true;
            }
            else {
LAB_00105e1e:
              uVar12 = uVar2;
              bVar1 = false;
            }
          }
        }
      }
LAB_00105e20:
      iVar4 = 0;
      switch(uVar12) {
      case 0:
      case 2:
        goto switchD_00105e37_caseD_0;
      default:
        return 0;
      case 3:
        goto switchD_00105e37_caseD_3;
      case 4:
        iVar4 = -1;
        goto switchD_00105e37_caseD_3;
      }
    }
    iVar4 = 0;
    g = (glist_t)0x0;
    local_270 = (glist_t)0x0;
    local_268 = (char *)0x0;
switchD_00105e37_caseD_3:
    fclose_comp((FILE *)__stream,local_25c);
    for (pgVar11 = g; pgVar11 != (glist_t)0x0; pgVar11 = pgVar11->next) {
      ckd_free((pgVar11->data).ptr);
    }
    glist_free(g);
    glist_free(local_270);
    ckd_free(local_268);
  }
  return iVar4;
switchD_00105e37_caseD_0:
  iVar3 = feof(__stream);
  if (iVar3 != 0) goto switchD_00105e37_caseD_3;
  goto LAB_00105d32;
}

Assistant:

int32
read_classdef_file(hash_table_t * classes, const char *file_name)
{
    FILE *fp;
    int32 is_pipe;
    int inclass;  /**< Are we currently reading a list of class words? */
    int32 rv = -1;
    gnode_t *gn;
    glist_t classwords = NULL;
    glist_t classprobs = NULL;
    char *classname = NULL;

    if ((fp = fopen_comp(file_name, "r", &is_pipe)) == NULL) {
        E_ERROR("File %s not found\n", file_name);
        return -1;
    }

    inclass = FALSE;
    while (!feof(fp)) {
        char line[512];
        char *wptr[2];
        int n_words;

        if (fgets(line, sizeof(line), fp) == NULL)
            break;

        n_words = str2words(line, wptr, 2);
        if (n_words <= 0)
            continue;

        if (inclass) {
            /* Look for an end of class marker. */
            if (n_words == 2 && 0 == strcmp(wptr[0], "END")) {
                classdef_t *classdef;
                gnode_t *word, *weight;
                int32 i;

                if (classname == NULL || 0 != strcmp(wptr[1], classname))
                    goto error_out;
                inclass = FALSE;

                /* Construct a class from the list of words collected. */
                classdef = ckd_calloc(1, sizeof(*classdef));
                classwords = glist_reverse(classwords);
                classprobs = glist_reverse(classprobs);
                classdef->n_words = glist_count(classwords);
                classdef->words = ckd_calloc(classdef->n_words,
                                             sizeof(*classdef->words));
                classdef->weights = ckd_calloc(classdef->n_words,
                                               sizeof(*classdef->weights));
                word = classwords;
                weight = classprobs;
                for (i = 0; i < classdef->n_words; ++i) {
                    classdef->words[i] = gnode_ptr(word);
                    classdef->weights[i] = gnode_float32(weight);
                    word = gnode_next(word);
                    weight = gnode_next(weight);
                }

                /* Add this class to the hash table. */
                if (hash_table_enter(classes, classname, classdef) !=
                    classdef) {
                    classdef_free(classdef);
                    goto error_out;
                }

                /* Reset everything. */
                glist_free(classwords);
                glist_free(classprobs);
                classwords = NULL;
                classprobs = NULL;
                classname = NULL;
            }
            else {
                float32 fprob;

                if (n_words == 2)
                    fprob = atof_c(wptr[1]);
                else
                    fprob = 1.0f;
                /* Add it to the list of words for this class. */
                classwords =
                    glist_add_ptr(classwords, ckd_salloc(wptr[0]));
                classprobs = glist_add_float32(classprobs, fprob);
            }
        }
        else {
            /* Start a new LM class if the LMCLASS marker is seen */
            if (n_words == 2 && 0 == strcmp(wptr[0], "LMCLASS")) {
                if (inclass)
                    goto error_out;
                inclass = TRUE;
                classname = ckd_salloc(wptr[1]);
            }
            /* Otherwise, just ignore whatever junk we got */
        }
    }
    rv = 0;                     /* Success. */

  error_out:
    /* Free all the stuff we might have allocated. */
    fclose_comp(fp, is_pipe);
    for (gn = classwords; gn; gn = gnode_next(gn))
        ckd_free(gnode_ptr(gn));
    glist_free(classwords);
    glist_free(classprobs);
    ckd_free(classname);

    return rv;
}